

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

int close_connect_only(connectdata *conn,void *param)

{
  Curl_easy *data;
  void *param_local;
  connectdata *conn_local;
  
  if (*(long *)((long)param + 0x1198) == conn->connection_id) {
    if (conn->data == (Curl_easy *)param) {
      conn->data = (Curl_easy *)0x0;
      if ((*(ulong *)&(conn->bits).field_0x4 >> 0x1d & 1) == 0) {
        conn_local._4_4_ = 1;
      }
      else {
        Curl_conncontrol(conn,1);
        *(ulong *)&(conn->bits).field_0x4 = *(ulong *)&(conn->bits).field_0x4 & 0xffffffffdfffffff;
        conn_local._4_4_ = 1;
      }
    }
    else {
      conn_local._4_4_ = 1;
    }
  }
  else {
    conn_local._4_4_ = 0;
  }
  return conn_local._4_4_;
}

Assistant:

static int close_connect_only(struct connectdata *conn, void *param)
{
  struct Curl_easy *data = param;

  if(data->state.lastconnect_id != conn->connection_id)
    return 0;

  if(conn->data != data)
    return 1;
  conn->data = NULL;

  if(!conn->bits.connect_only)
    return 1;

  connclose(conn, "Removing connect-only easy handle");
  conn->bits.connect_only = FALSE;

  return 1;
}